

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O2

int __thiscall sp::template_classifier::get_threshold_(template_classifier *this,Mat *mat)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint32_t i;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  int histogram [256];
  
  auVar12 = in_ZMM0._0_16_;
  iVar7 = *(int *)(mat + 0xc) * *(int *)(mat + 8);
  bVar11 = (*(uint *)mat >> 0xe & 1) != 0;
  iVar5 = *(int *)(mat + 0xc);
  if (bVar11) {
    iVar5 = iVar7;
  }
  iVar9 = 1;
  if (!bVar11) {
    iVar9 = *(int *)(mat + 8);
  }
  memset(histogram,0,0x400);
  lVar6 = *(long *)(mat + 0x10);
  plVar2 = *(long **)(mat + 0x48);
  for (iVar10 = 0; iVar10 != iVar9; iVar10 = iVar10 + 1) {
    lVar3 = *plVar2;
    for (lVar8 = 0; iVar5 != (int)lVar8; lVar8 = lVar8 + 1) {
      histogram[*(byte *)(iVar10 * lVar3 + lVar6 + lVar8)] =
           histogram[*(byte *)(iVar10 * lVar3 + lVar6 + lVar8)] + 1;
    }
  }
  auVar12 = vcvtusi2sd_avx512f(auVar12,iVar7);
  dVar4 = auVar12._0_8_ * this->thre_proportion;
  lVar6 = 0xff;
  do {
    piVar1 = histogram + lVar6;
    lVar6 = lVar6 + -1;
    dVar4 = dVar4 - (double)*piVar1;
  } while (0.0 < dVar4);
  return ~((int)(uint)lVar6 >> 0x1f) & (uint)lVar6;
}

Assistant:

inline int         get_threshold_(cv::Mat& mat)
	{
	    uint32_t iter_rows = mat.rows;
	    uint32_t iter_cols = mat.cols;
	    auto sum_pixel = iter_rows * iter_cols;
	    if(mat.isContinuous())
	    {
	        iter_cols = sum_pixel;
	        iter_rows = 1;
	    }
	    int histogram[256];
	    memset(histogram, 0, sizeof(histogram));
	    for (uint32_t i = 0; i < iter_rows; ++i)
	    {
	        const uchar* lhs = mat.ptr<uchar>(i);
	        for (uint32_t j = 0; j < iter_cols; ++j)
	            ++histogram[*lhs++];
	    }
	    auto left = thre_proportion * sum_pixel;
	    int i = 255;
	    while((left -= histogram[i--]) > 0);
	    return std::max(i, 0);
	}